

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodePtr xmlXPathNextPrecedingInternal(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  _xmlNode **pp_Var1;
  xmlXPathContextPtr pxVar2;
  _xmlNode *p_Var3;
  xmlNodePtr pxVar4;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) ||
     (pxVar2 = ctxt->context, pxVar2 == (xmlXPathContextPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    cur = pxVar2->node;
    if (cur == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
      cur = (xmlNodePtr)cur->_private;
      if (cur == (xmlNodePtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (cur->type == XML_NAMESPACE_DECL) {
        return (xmlNodePtr)0x0;
      }
    }
    else if (cur->type == XML_ATTRIBUTE_NODE) {
      cur = cur->parent;
    }
    ctxt->ancestor = cur->parent;
  }
  if (cur->type == XML_NAMESPACE_DECL) {
    return (xmlNodePtr)0x0;
  }
  pxVar4 = cur->prev;
  if (pxVar4 != (xmlNodePtr)0x0) {
    if (pxVar4->type == XML_DTD_NODE) {
      cur = pxVar4;
    }
    p_Var3 = cur->prev;
    if (cur->prev != (xmlNodePtr)0x0) goto LAB_001e94bb;
  }
  pxVar4 = cur->parent;
  do {
    if (pxVar4 == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    if (pxVar4 == pxVar2->doc->children) {
      return (xmlNodePtr)0x0;
    }
    if (pxVar4 != ctxt->ancestor) {
      return pxVar4;
    }
    p_Var3 = pxVar4->parent;
    ctxt->ancestor = p_Var3;
    pp_Var1 = &pxVar4->prev;
    pxVar4 = p_Var3;
    p_Var3 = *pp_Var1;
  } while (*pp_Var1 == (xmlNodePtr)0x0);
LAB_001e94bb:
  do {
    pxVar4 = p_Var3;
    p_Var3 = pxVar4->last;
  } while (p_Var3 != (_xmlNode *)0x0);
  return pxVar4;
}

Assistant:

static xmlNodePtr
xmlXPathNextPrecedingInternal(xmlXPathParserContextPtr ctxt,
                              xmlNodePtr cur)
{
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur == NULL)
            return (NULL);
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
        ctxt->ancestor = cur->parent;
    }
    if (cur->type == XML_NAMESPACE_DECL)
        return(NULL);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE))
	cur = cur->prev;
    while (cur->prev == NULL) {
        cur = cur->parent;
        if (cur == NULL)
            return (NULL);
        if (cur == ctxt->context->doc->children)
            return (NULL);
        if (cur != ctxt->ancestor)
            return (cur);
        ctxt->ancestor = cur->parent;
    }
    cur = cur->prev;
    while (cur->last != NULL)
        cur = cur->last;
    return (cur);
}